

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchOut.cpp
# Opt level: O1

int Bmatch_Output(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,vector<Node,_std::allocator<Node>_> *inGroup,
                 vector<Node,_std::allocator<Node>_> *outGroup,
                 vector<Node,_std::allocator<Node>_> *constGroup,int *maxScore,char *filename)

{
  vector<Node,_std::allocator<Node>_> *pvVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  Abc_Obj_t *pAVar5;
  char cVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  ofstream f;
  vector<Node,_std::allocator<Node>_> *local_258;
  Abc_Ntk_t *local_250;
  int local_244;
  vector<Node,_std::allocator<Node>_> *local_240;
  vector<Node,_std::allocator<Node>_> *local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  lVar7 = (long)pNtk1->vPos->nSize;
  if (lVar7 < 1) {
    local_244 = 0;
  }
  else {
    lVar11 = 0;
    local_244 = 0;
    do {
      lVar3 = *(long *)((long)&(outGroup->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                               super__Vector_impl_data._M_finish + lVar11);
      lVar4 = *(long *)((long)&(outGroup->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar11);
      iVar12 = (int)((ulong)(lVar3 - lVar4) >> 3) + 0xb;
      if (lVar3 == lVar4) {
        iVar12 = 0;
      }
      local_244 = local_244 + iVar12;
      lVar11 = lVar11 + 0x18;
    } while (lVar7 * 0x18 != lVar11);
  }
  if (*maxScore < local_244) {
    local_258 = constGroup;
    local_250 = pNtk1;
    local_240 = outGroup;
    local_238 = inGroup;
    std::ofstream::ofstream((ostream *)&local_230,filename,_S_out);
    pVVar10 = local_250->vPos;
    cVar6 = (char)(ostream *)&local_230;
    if (0 < pVVar10->nSize) {
      lVar7 = 0;
      do {
        if (local_240[lVar7].super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_240[lVar7].super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pAVar5 = (Abc_Obj_t *)pVVar10->pArray[lVar7];
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"OUTGROUP",8);
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"1 + ",4);
          pcVar8 = Abc_ObjName(pAVar5);
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)&local_258 + (int)*(undefined8 *)(local_230 + -0x18) + 0x28);
          }
          else {
            sVar9 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar8,sVar9);
          }
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
          pvVar1 = local_240 + lVar7;
          if ((pvVar1->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
              super__Vector_impl_data._M_finish !=
              (pvVar1->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
              super__Vector_impl_data._M_start) {
            uVar13 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"2 ",2);
              pcVar8 = "+ ";
              if ((pvVar1->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar13].inv != false) {
                pcVar8 = "- ";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar8,2);
              uVar2 = (pvVar1->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar13].id;
              if (((long)(int)uVar2 < 0) || (pNtk2->vPos->nSize <= (int)uVar2)) goto LAB_007b40e3;
              pcVar8 = Abc_ObjName((Abc_Obj_t *)pNtk2->vPos->pArray[(int)uVar2]);
              if (pcVar8 == (char *)0x0) {
                std::ios::clear((int)&local_258 + (int)*(undefined8 *)(local_230 + -0x18) + 0x28);
              }
              else {
                sVar9 = strlen(pcVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,pcVar8,sVar9);
              }
              std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar6);
              std::ostream::put(cVar6);
              std::ostream::flush();
              uVar13 = uVar13 + 1;
            } while (uVar13 < (ulong)((long)(pvVar1->super__Vector_base<Node,_std::allocator<Node>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pvVar1->super__Vector_base<Node,_std::allocator<Node>_>
                                            )._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"END",3);
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
        }
        lVar7 = lVar7 + 1;
        pVVar10 = local_250->vPos;
      } while (lVar7 < pVVar10->nSize);
    }
    pVVar10 = local_250->vPis;
    if (0 < pVVar10->nSize) {
      lVar7 = 0;
      do {
        if (local_238[lVar7].super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_238[lVar7].super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pAVar5 = (Abc_Obj_t *)pVVar10->pArray[lVar7];
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"INGROUP",7);
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"1 + ",4);
          pcVar8 = Abc_ObjName(pAVar5);
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)&local_258 + (int)*(undefined8 *)(local_230 + -0x18) + 0x28);
          }
          else {
            sVar9 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar8,sVar9);
          }
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
          pvVar1 = local_238 + lVar7;
          if ((pvVar1->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
              super__Vector_impl_data._M_finish !=
              (pvVar1->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
              super__Vector_impl_data._M_start) {
            uVar13 = 0;
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"2 ",2);
              pcVar8 = "+ ";
              if ((pvVar1->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar13].inv != false) {
                pcVar8 = "- ";
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar8,2);
              uVar2 = (pvVar1->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar13].id;
              if (((long)(int)uVar2 < 0) || (pNtk2->vPis->nSize <= (int)uVar2)) goto LAB_007b40e3;
              pcVar8 = Abc_ObjName((Abc_Obj_t *)pNtk2->vPis->pArray[(int)uVar2]);
              if (pcVar8 == (char *)0x0) {
                std::ios::clear((int)&local_258 + (int)*(undefined8 *)(local_230 + -0x18) + 0x28);
              }
              else {
                sVar9 = strlen(pcVar8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_230,pcVar8,sVar9);
              }
              std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar6);
              std::ostream::put(cVar6);
              std::ostream::flush();
              uVar13 = uVar13 + 1;
            } while (uVar13 < (ulong)((long)(pvVar1->super__Vector_base<Node,_std::allocator<Node>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pvVar1->super__Vector_base<Node,_std::allocator<Node>_>
                                            )._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"END",3);
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
        }
        lVar7 = lVar7 + 1;
        pVVar10 = local_250->vPis;
      } while (lVar7 < pVVar10->nSize);
    }
    if ((local_258->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.super__Vector_impl_data
        ._M_finish !=
        (local_258->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.super__Vector_impl_data
        ._M_start) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"CONST0GROUP",0xb);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      cVar6 = (char)(ostream *)&local_230;
      std::ostream::put(cVar6);
      std::ostream::flush();
      if ((local_258->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
          super__Vector_impl_data._M_finish !=
          (local_258->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        uVar13 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"2 ",2);
          pcVar8 = "+ ";
          if ((local_258->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar13].inv != false) {
            pcVar8 = "- ";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar8,2);
          uVar2 = (local_258->super__Vector_base<Node,_std::allocator<Node>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar13].id;
          if (((long)(int)uVar2 < 0) || (pNtk2->vPis->nSize <= (int)uVar2)) {
LAB_007b40e3:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pcVar8 = Abc_ObjName((Abc_Obj_t *)pNtk2->vPis->pArray[(int)uVar2]);
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)&local_258 + (int)*(undefined8 *)(local_230 + -0x18) + 0x28);
          }
          else {
            sVar9 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,pcVar8,sVar9);
          }
          std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar6);
          std::ostream::put(cVar6);
          std::ostream::flush();
          uVar13 = uVar13 + 1;
        } while (uVar13 < (ulong)((long)(local_258->super__Vector_base<Node,_std::allocator<Node>_>)
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_258->super__Vector_base<Node,_std::allocator<Node>_>)
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"END",3);
      std::ios::widen((char)(ostream *)&local_230 + (char)*(undefined8 *)(local_230 + -0x18));
      std::ostream::put((char)&local_230);
      std::ostream::flush();
    }
    cVar6 = std::__basic_file<char>::is_open();
    if (cVar6 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Create \"",8);
      if (filename == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0xdfb2e8);
      }
      else {
        sVar9 = strlen(filename);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,filename,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\" success!",10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
      std::ostream::put(-0x18);
      std::ostream::flush();
    }
    std::ofstream::close();
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(local_138);
  }
  return local_244;
}

Assistant:

int Bmatch_Output( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, vector<Node> * inGroup, vector<Node> * outGroup, vector<Node> * constGroup, const int & maxScore, const char* filename )
{    
    // For loops
    int i, score = 0;
    Abc_Obj_t * pObj;
 
    Abc_NtkForEachPo( pNtk1, pObj, i )
    {
        if(outGroup[i].size()){
            score += 11 + outGroup[i].size();
        }
    }    
    if( score <= maxScore )
        return score;

    ofstream f(filename);
    // ostream & f = cout; // For debugging
    
    Abc_NtkForEachPo( pNtk1, pObj, i )
    {
        if(outGroup[i].size())
        {
            f << "OUTGROUP" << endl;
            f << "1 + " << Abc_ObjName( pObj ) << endl;
            for (int j = 0; j < outGroup[i].size(); ++j)
                f << "2 " << (outGroup[i][j].inv ? "- " : "+ ") <<  Abc_ObjName( Abc_NtkPo(pNtk2, outGroup[i][j].id) ) << endl;
            f << "END" << endl;
        }
    }

    Abc_NtkForEachPi( pNtk1, pObj, i )
    {
        if(inGroup[i].size())
        {
            f << "INGROUP" << endl;
            f << "1 + " << Abc_ObjName( pObj ) << endl;
            for (int j = 0; j < inGroup[i].size(); ++j)
                f << "2 " << (inGroup[i][j].inv ? "- " : "+ ") <<  Abc_ObjName( Abc_NtkPi(pNtk2, inGroup[i][j].id) ) << endl;
            f << "END" << endl;
        }
    }

    if((*constGroup).size())
    {
        f << "CONST0GROUP" << endl;
        for (int j = 0; j < (*constGroup).size(); ++j)
            f << "2 " << ((*constGroup)[j].inv ? "- " : "+ ") << Abc_ObjName( Abc_NtkPi(pNtk2, (*constGroup)[j].id) ) << endl;
        f << "END" << endl;
    }

    if (f.is_open()) cout << "Create \"" << filename << "\" success!" << endl;
    f.close();
    return score;
}